

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void __thiscall
Eigen::
TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,false>const,2u,Eigen::Dense>
::solveInPlace<1,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
          (TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>const,2u,Eigen::Dense>
           *this,MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                 *_other)

{
  MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0> *this_00;
  TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_2U>
  *pTVar1;
  Index IVar2;
  Index IVar3;
  NestedExpression *lhs;
  bool bVar4;
  OtherCopy otherCopy;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *other;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *_other_local;
  TriangularViewImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_2U,_Eigen::Dense>
  *this_local;
  
  this_00 = (MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0> *)
            EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
            const_cast_derived((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                                *)_other);
  pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>_>
           ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_2U>_>
                      *)this);
  IVar2 = TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>
          ::cols(pTVar1);
  pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>_>
           ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_2U>_>
                      *)this);
  IVar3 = TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>
          ::rows(pTVar1);
  bVar4 = false;
  if (IVar2 == IVar3) {
    pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>_>
             ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_2U>_>
                        *)this);
    IVar2 = TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>
            ::cols(pTVar1);
    IVar3 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::rows
                      (this_00);
    bVar4 = IVar2 == IVar3;
  }
  if (!bVar4) {
    __assert_fail("derived().cols() == derived().rows() && ((Side==OnTheLeft && derived().cols() == other.rows()) || (Side==OnTheRight && derived().cols() == other.cols()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/SolveTriangular.h"
                  ,0xaa,
                  "void Eigen::TriangularViewImpl<const Eigen::Block<const Eigen::Matrix<float, -1, -1>>, 2, Eigen::Dense>::solveInPlace(const MatrixBase<OtherDerived> &) const [_MatrixType = const Eigen::Block<const Eigen::Matrix<float, -1, -1>>, _Mode = 2, StorageKind = Eigen::Dense, Side = 1, OtherDerived = Eigen::Block<Eigen::Matrix<float, -1, -1>>]"
                 );
  }
  pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>_>
           ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_2U>_>
                      *)this);
  IVar2 = TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>
          ::cols(pTVar1);
  if (IVar2 != 0) {
    pTVar1 = TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>_>
             ::derived((TriangularBase<Eigen::TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_2U>_>
                        *)this);
    lhs = TriangularView<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2U>
          ::nestedExpression(pTVar1);
    internal::
    triangular_solver_selector<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_2,_0,_-1>
    ::run(lhs,(Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)this_00);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC void TriangularViewImpl<MatrixType,Mode,Dense>::solveInPlace(const MatrixBase<OtherDerived>& _other) const
{
  OtherDerived& other = _other.const_cast_derived();
  eigen_assert( derived().cols() == derived().rows() && ((Side==OnTheLeft && derived().cols() == other.rows()) || (Side==OnTheRight && derived().cols() == other.cols())) );
  eigen_assert((!(int(Mode) & int(ZeroDiag))) && bool(int(Mode) & (int(Upper) | int(Lower))));
  // If solving for a 0x0 matrix, nothing to do, simply return.
  if (derived().cols() == 0)
    return;

  enum { copy = (internal::traits<OtherDerived>::Flags & RowMajorBit)  && OtherDerived::IsVectorAtCompileTime && OtherDerived::SizeAtCompileTime!=1};
  typedef typename internal::conditional<copy,
    typename internal::plain_matrix_type_column_major<OtherDerived>::type, OtherDerived&>::type OtherCopy;
  OtherCopy otherCopy(other);

  internal::triangular_solver_selector<MatrixType, typename internal::remove_reference<OtherCopy>::type,
    Side, Mode>::run(derived().nestedExpression(), otherCopy);

  if (copy)
    other = otherCopy;
}